

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O1

aiReturn __thiscall Assimp::Importer::RegisterPPStep(Importer *this,BaseProcess *pImp)

{
  pointer *pppBVar1;
  ImporterPimpl *pIVar2;
  iterator __position;
  Logger *this_00;
  BaseProcess *local_10;
  
  local_10 = pImp;
  if (pImp != (BaseProcess *)0x0) {
    pIVar2 = this->pimpl;
    __position._M_current =
         (pIVar2->mPostProcessingSteps).
         super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pIVar2->mPostProcessingSteps).
        super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>::
      _M_realloc_insert<Assimp::BaseProcess*const&>
                ((vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>> *)
                 &pIVar2->mPostProcessingSteps,__position,&local_10);
    }
    else {
      *__position._M_current = pImp;
      pppBVar1 = &(pIVar2->mPostProcessingSteps).
                  super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppBVar1 = *pppBVar1 + 1;
    }
    this_00 = DefaultLogger::get();
    Logger::info(this_00,"Registering custom post-processing step");
    return aiReturn_SUCCESS;
  }
  __assert_fail("nullptr != pImp",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Importer.cpp"
                ,0xca,"aiReturn Assimp::Importer::RegisterPPStep(BaseProcess *)");
}

Assistant:

aiReturn Importer::RegisterPPStep(BaseProcess* pImp) {
    ai_assert( nullptr != pImp );
    
    ASSIMP_BEGIN_EXCEPTION_REGION();

        pimpl->mPostProcessingSteps.push_back(pImp);
        ASSIMP_LOG_INFO("Registering custom post-processing step");

    ASSIMP_END_EXCEPTION_REGION(aiReturn);
    return AI_SUCCESS;
}